

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

void __thiscall SpriteBase::del(SpriteBase *this,PSprite *other)

{
  size_t sVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint local_2c;
  uint8_t *puStack_28;
  uint i;
  uint32_t *res;
  uint32_t *src;
  PSprite *other_local;
  SpriteBase *this_local;
  
  sVar1 = this->width;
  peVar3 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )other);
  iVar2 = (*peVar3->_vptr_Sprite[1])();
  if (sVar1 == CONCAT44(extraout_var,iVar2)) {
    sVar1 = this->height;
    peVar3 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)other);
    iVar2 = (*peVar3->_vptr_Sprite[2])();
    if (sVar1 == CONCAT44(extraout_var_00,iVar2)) {
      peVar3 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)other);
      iVar2 = (**peVar3->_vptr_Sprite)();
      puStack_28 = this->data;
      res = (uint32_t *)CONCAT44(extraout_var_01,iVar2);
      for (local_2c = 0; (ulong)local_2c < this->width * this->height; local_2c = local_2c + 1) {
        if (*res == 0xffffffff) {
          puStack_28[0] = '\0';
          puStack_28[1] = '\0';
          puStack_28[2] = '\0';
          puStack_28[3] = '\0';
        }
        puStack_28 = puStack_28 + 4;
        res = res + 1;
      }
    }
  }
  return;
}

Assistant:

void
SpriteBase::del(Data::PSprite other) {
  if ((width != other->get_width()) || (height != other->get_height())) {
    return;
  }

  uint32_t *src = reinterpret_cast<uint32_t*>(other->get_data());
  uint32_t *res = reinterpret_cast<uint32_t*>(data);

  for (unsigned int i = 0; i < width * height; i++) {
    if (*src++ == 0xFFFFFFFF) {
      *res = 0x00000000;
    }
    res++;
  }

  return;
}